

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void generate_exception_err(DisasContext_conflict6 *ctx,int excp,int err)

{
  TCGContext_conflict6 *tcg_ctx_00;
  TCGv_i32 arg2;
  TCGv_i32 arg3;
  TCGv_i32 terr;
  TCGv_i32 texcp;
  TCGContext_conflict6 *tcg_ctx;
  int err_local;
  int excp_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  arg2 = tcg_const_i32_mips64el(tcg_ctx_00,excp);
  arg3 = tcg_const_i32_mips64el(tcg_ctx_00,err);
  save_cpu_state(ctx,1);
  gen_helper_raise_exception_err(tcg_ctx_00,tcg_ctx_00->cpu_env,arg2,arg3);
  tcg_temp_free_i32(tcg_ctx_00,arg3);
  tcg_temp_free_i32(tcg_ctx_00,arg2);
  (ctx->base).is_jmp = DISAS_NORETURN;
  return;
}

Assistant:

static inline void generate_exception_err(DisasContext *ctx, int excp, int err)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 texcp = tcg_const_i32(tcg_ctx, excp);
    TCGv_i32 terr = tcg_const_i32(tcg_ctx, err);
    save_cpu_state(ctx, 1);
    gen_helper_raise_exception_err(tcg_ctx, tcg_ctx->cpu_env, texcp, terr);
    tcg_temp_free_i32(tcg_ctx, terr);
    tcg_temp_free_i32(tcg_ctx, texcp);
    ctx->base.is_jmp = DISAS_NORETURN;
}